

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O3

char * duckdb_shell_sqlite3_snprintf(int n,char *zBuf,char *zFormat,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  StrAccum local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_108.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_108.overflow_arg_area = &ap[0].overflow_arg_area;
  local_108.gp_offset = 0x18;
  local_108.fp_offset = 0x30;
  if (0 < n) {
    local_e8.db = (void *)0x0;
    local_e8.mxAlloc = 0;
    local_e8.nChar = 0;
    local_e8.accError = '\0';
    local_e8.printfFlags = '\0';
    local_e8.zText = zBuf;
    local_e8.nAlloc = n;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    duckdb_shell_sqlite3VXPrintf(&local_e8,zFormat,&local_108);
    zBuf[(ulong)local_e8._20_8_ >> 0x20] = '\0';
  }
  return zBuf;
}

Assistant:

char *sqlite3_snprintf(int n, char *zBuf, const char *zFormat, ...) {
	char *z;
	va_list ap;
	va_start(ap, zFormat);
	z = sqlite3_vsnprintf(n, zBuf, zFormat, ap);
	va_end(ap);
	return z;
}